

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

void __thiscall
mjs::global_object_impl::define_thrower_accessor
          (global_object_impl *this,object *o,char *property_name)

{
  property_attribute attr;
  object_ptr local_40;
  string local_30;
  char *local_20;
  char *property_name_local;
  object *o_local;
  global_object_impl *this_local;
  
  local_20 = property_name;
  property_name_local = (char *)o;
  o_local = (object *)this;
  (*(this->super_global_object).super_object._vptr_object[0x13])(&local_30,this,property_name);
  object::heap((object *)this);
  gc_heap_ptr_untracked<mjs::object,_true>::track
            ((gc_heap_ptr_untracked<mjs::object,_true> *)&local_40,(gc_heap *)&this->thrower_);
  attr = operator|(dont_enum,dont_delete);
  object::define_accessor_property(o,&local_30,&local_40,attr);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_40);
  string::~string(&local_30);
  return;
}

Assistant:

void define_thrower_accessor(object& o, const char* property_name) override {
        o.define_accessor_property(common_string(property_name), thrower_.track(heap()), property_attribute::dont_enum|property_attribute::dont_delete);
    }